

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::timerEvent(QMenu *this,QTimerEvent *e)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QMenuPrivate *this_00;
  QMenu *pQVar4;
  QMenuPrivate *d;
  undefined2 in_stack_00000038;
  bool in_stack_0000003a;
  bool in_stack_0000003b;
  ScrollDirection in_stack_0000003c;
  QMenuPrivate *in_stack_00000040;
  int in_stack_ffffffffffffffcc;
  QMenuSloppyState *this_01;
  
  this_00 = d_func((QMenu *)0x64dcc1);
  if (this_00->scroll != (QMenuScroller *)0x0) {
    iVar2 = QBasicTimer::timerId((QBasicTimer *)0x64dcea);
    iVar3 = QTimerEvent::timerId((QTimerEvent *)0x64dcf8);
    if (iVar2 == iVar3) {
      QMenuPrivate::scrollMenu
                (in_stack_00000040,in_stack_0000003c,in_stack_0000003b,in_stack_0000003a);
      if (this_00->scroll->scrollFlags != '\0') {
        return;
      }
      QBasicTimer::stop();
      return;
    }
  }
  iVar2 = QBasicTimer::timerId((QBasicTimer *)0x64dd64);
  iVar3 = QTimerEvent::timerId((QTimerEvent *)0x64dd72);
  if (iVar2 == iVar3) {
    if ((this_00->currentAction == (QAction *)0x0) ||
       (pQVar4 = QAction::menu<QMenu*>((QAction *)0x64dd9c), pQVar4 != (QMenu *)0x0)) {
      QMenuPrivate::DelayState::stop((DelayState *)0x64ddb8);
      QMenuSloppyState::stopTimer((QMenuSloppyState *)0x64ddc9);
      internalDelayedPopup
                ((QMenu *)CONCAT44(in_stack_0000003c,
                                   CONCAT13(in_stack_0000003b,
                                            CONCAT12(in_stack_0000003a,in_stack_00000038))));
    }
  }
  else {
    this_01 = &this_00->sloppyState;
    QTimerEvent::timerId((QTimerEvent *)0x64ddef);
    bVar1 = QMenuSloppyState::isTimerId(this_01,in_stack_ffffffffffffffcc);
    if (bVar1) {
      QMenuSloppyState::timeout((QMenuSloppyState *)this_00);
    }
    else {
      iVar2 = QBasicTimer::timerId((QBasicTimer *)0x64de25);
      iVar3 = QTimerEvent::timerId((QTimerEvent *)0x64de33);
      if (iVar2 == iVar3) {
        QString::clear((QString *)this_01);
      }
    }
  }
  return;
}

Assistant:

void
QMenu::timerEvent(QTimerEvent *e)
{
    Q_D(QMenu);
    if (d->scroll && d->scroll->scrollTimer.timerId() == e->timerId()) {
        d->scrollMenu((QMenuPrivate::QMenuScroller::ScrollDirection)d->scroll->scrollDirection);
        if (d->scroll->scrollFlags == QMenuPrivate::QMenuScroller::ScrollNone)
            d->scroll->scrollTimer.stop();
    } else if (d->delayState.timer.timerId() == e->timerId()) {
        if (d->currentAction && !d->currentAction->menu())
            return;
        d->delayState.stop();
        d->sloppyState.stopTimer();
        internalDelayedPopup();
    } else if (d->sloppyState.isTimerId(e->timerId())) {
        d->sloppyState.timeout();
    } else if (d->searchBufferTimer.timerId() == e->timerId()) {
        d->searchBuffer.clear();
    }
}